

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline_listener.c
# Opt level: O0

HT_TimelineListenerContainer * ht_find_or_create_listener(char *name)

{
  HT_TimelineListenerContainer *local_18;
  HT_TimelineListenerContainer *container;
  char *name_local;
  
  if (name == (char *)0x0) {
    local_18 = ht_timeline_listener_container_create();
  }
  else {
    local_18 = ht_registry_find_listener_container(name);
    if (local_18 == (HT_TimelineListenerContainer *)0x0) {
      local_18 = ht_timeline_listener_container_create();
      if (local_18 != (HT_TimelineListenerContainer *)0x0) {
        ht_registry_register_listener_container(name,local_18);
      }
    }
    else {
      local_18->refcount = local_18->refcount + 1;
    }
  }
  return local_18;
}

Assistant:

HT_TimelineListenerContainer*
ht_find_or_create_listener(const char* name)
{
    HT_TimelineListenerContainer* container;

    if (name == NULL)
    {
        container = ht_timeline_listener_container_create();
    }
    else
    {
        container = ht_registry_find_listener_container(name);
        if (container == NULL)
        {
            container = ht_timeline_listener_container_create();
            if (container != NULL)
            {
                ht_registry_register_listener_container(name, container);
            }
        }
        else
        {
            container->refcount++;
        }
    }

    return container;
}